

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

float plutovg_path_extents(plutovg_path_t *path,plutovg_rect_t *extents,_Bool tight)

{
  undefined7 in_register_00000011;
  extents_calculator_t calculator;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 1;
  if ((int)CONCAT71(in_register_00000011,tight) == 0) {
    plutovg_path_traverse(path,extents_traverse_func,&local_28);
  }
  else {
    plutovg_path_traverse_flatten(path,extents_traverse_func,&local_28);
  }
  if (extents != (plutovg_rect_t *)0x0) {
    extents->x = (float)local_18;
    extents->y = local_18._4_4_;
    extents->w = (float)uStack_10 - (float)local_18;
    extents->h = uStack_10._4_4_ - local_18._4_4_;
  }
  return uStack_20._4_4_;
}

Assistant:

float plutovg_path_extents(const plutovg_path_t* path, plutovg_rect_t* extents, bool tight)
{
    extents_calculator_t calculator = {{0, 0}, true, 0, 0, 0, 0, 0};
    if(tight) {
        plutovg_path_traverse_flatten(path, extents_traverse_func, &calculator);
    } else {
        plutovg_path_traverse(path, extents_traverse_func, &calculator);
    }

    if(extents) {
        extents->x = calculator.x1;
        extents->y = calculator.y1;
        extents->w = calculator.x2 - calculator.x1;
        extents->h = calculator.y2 - calculator.y1;
    }

    return calculator.length;
}